

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

Time __thiscall
miniros::TimeBase<miniros::Time,_miniros::Duration>::operator+
          (TimeBase<miniros::Time,_miniros::Duration> *this,Duration *rhs)

{
  int64_t nsec_sum;
  int64_t sec_sum;
  uint64_t nsec64;
  uint64_t sec64;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  
  local_28 = (long)(rhs->super_DurationBase<miniros::Duration>).sec + (ulong)this->sec;
  local_30 = (long)(rhs->super_DurationBase<miniros::Duration>).nsec + (ulong)this->nsec;
  normalizeSecNSecUnsigned((int64_t *)&local_28,(int64_t *)&local_30);
  local_18 = local_28 & 0xffffffff;
  local_20 = local_30 & 0xffffffff;
  normalizeSecNSec(&local_18,&local_20);
  return (Time)(local_20 << 0x20 | local_18 & 0xffffffff);
}

Assistant:

T TimeBase<T, D>::operator+(const D &rhs) const
  {
    int64_t sec_sum  = static_cast<uint64_t>(sec) + static_cast<uint64_t>(rhs.sec);
    int64_t nsec_sum = static_cast<uint64_t>(nsec) + static_cast<uint64_t>(rhs.nsec);

    // Throws an exception if we go out of 32-bit range
    normalizeSecNSecUnsigned(sec_sum, nsec_sum);

    // now, it's safe to downcast back to uint32 bits
    return T(static_cast<uint32_t>(sec_sum), static_cast<uint32_t>(nsec_sum));
  }